

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O2

Result_t __thiscall
sig::Slot<void(int),std::function<void(int)>>::operator()
          (Slot<void(int),std::function<void(int)>> *this,int *args)

{
  bool bVar1;
  Locked_container_t l;
  Locked_container_t LStack_28;
  
  bVar1 = Slot_base::expired((Slot_base *)this);
  if (!bVar1) {
    Slot_base::lock(&LStack_28,(Slot_base *)this);
    std::function<void_(int)>::operator()((function<void_(int)> *)(this + 0x20),*args);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector(&LStack_28)
    ;
  }
  return;
}

Assistant:

Result_t operator()(Arguments&&... args) const {
        if (this->expired()) {
            return Result_t();
        }
        auto l = this->lock();
        return function_(std::forward<Arguments>(args)...);
    }